

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

string * __thiscall re2::Prog::DumpByteMap_abi_cxx11_(string *__return_storage_ptr__,Prog *this)

{
  long lVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar5 = 0;
  do {
    iVar4 = (int)uVar5;
    if (0xff < iVar4) {
      return __return_storage_ptr__;
    }
    iVar2 = 1;
    lVar3 = (long)iVar4;
    do {
      if (lVar3 == 0xff) {
        uVar6 = 0xff;
        goto LAB_001abd4c;
      }
      iVar2 = iVar2 + -1;
      lVar1 = lVar3 + 1;
      lVar3 = lVar3 + 1;
    } while (this->bytemap_[lVar1] == this->bytemap_[iVar4]);
    uVar6 = iVar4 - iVar2;
LAB_001abd4c:
    StringPrintf_abi_cxx11_(&local_50,"[%02x-%02x] -> %d\n",uVar5,(ulong)uVar6);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    uVar5 = (ulong)(uVar6 + 1);
  } while( true );
}

Assistant:

std::string Prog::DumpByteMap() {
  std::string map;
  for (int c = 0; c < 256; c++) {
    int b = bytemap_[c];
    int lo = c;
    while (c < 256-1 && bytemap_[c+1] == b)
      c++;
    int hi = c;
    map += StringPrintf("[%02x-%02x] -> %d\n", lo, hi, b);
  }
  return map;
}